

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O2

void __thiscall JSON::JSON_string::JSON_string(JSON_string *this,string *utf8)

{
  (this->super_JSON_value).type_code = vt_string;
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_string_002abfd0;
  std::__cxx11::string::string((string *)&this->utf8,(string *)utf8);
  return;
}

Assistant:

JSON_value(value_type_e type_code) :
            type_code(type_code)
        {
        }